

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearDriveline::VariablesQbLoadSpeed(ChLinkMotorLinearDriveline *this)

{
  (**(code **)(**(long **)&(this->super_ChLinkMotorLinear).field_0x278 + 0x160))();
  (*(((this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x2c])();
  (*(((this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x2c])();
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::VariablesQbLoadSpeed() {
    // First, inherit to parent class
    ChLinkMotorLinear::VariablesQbLoadSpeed();

    innershaft1lin->VariablesQbLoadSpeed();
    innershaft2lin->VariablesQbLoadSpeed();
    innershaft2rot->VariablesQbLoadSpeed();
}